

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  pointer pbVar2;
  size_type __len1;
  pointer ppVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  size_t __len2;
  long lVar9;
  int iVar10;
  pointer args_00;
  pointer this;
  bool bVar11;
  iter __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  findstr f;
  string excludepaths;
  ArgIterator __begin1;
  iter __end5;
  undefined1 local_248 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  pointer local_218;
  uint local_200;
  uint local_1fc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  findstr local_1e0;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
  local_150;
  undefined1 local_128 [32];
  undefined2 local_108;
  iter local_98;
  fileenumerator local_50;
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.pattern._M_dataplus._M_p = (pointer)&local_1e0.pattern.field_2;
  local_1e0.matchcount = 0;
  local_1e0.searchtype = REGEX_SEARCH;
  local_1e0.matchword = false;
  local_1e0.matchbinary = false;
  local_1e0.matchcase = false;
  local_1e0.matchstart = false;
  local_1e0.firstmatch = false;
  local_1e0.pattern_is_hex = false;
  local_1e0.pattern_is_guid = false;
  local_1e0.verbose = 0;
  local_1e0.list_only = false;
  local_1e0.count_only = false;
  local_1e0.readcontinuous = false;
  local_1e0.use_sequential = false;
  local_1e0.maxfilesize = 0;
  local_1e0.nameprinted = false;
  local_1e0.pattern._M_string_length = 0;
  local_1e0.pattern.field_2._M_local_buf[0] = '\0';
  local_1e0.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180 = &local_170;
  local_178 = 0;
  local_170 = 0;
  local_128._12_4_ = 1;
  local_108._0_1_ = false;
  local_108._1_1_ = false;
  if (argc == 1) {
    local_128._16_8_ = (char *)0x0;
    local_128._24_8_ = (char *)0x0;
  }
  else {
    local_128._16_8_ = argv[1];
    if (*(char *)local_128._16_8_ == '\0') {
      lVar8 = 0;
    }
    else {
      lVar9 = 0;
      do {
        lVar8 = lVar9 + 1;
        lVar1 = lVar9 + 1;
        lVar9 = lVar8;
      } while (*(char *)(local_128._16_8_ + lVar1) != '\0');
    }
    local_128._24_8_ = local_128._16_8_ + lVar8;
  }
  bVar11 = (char *)local_128._16_8_ != (char *)0x0 || argc != 1;
  local_128._0_8_ = argv;
  local_128._8_4_ = argc;
  if ((char *)local_128._16_8_ != (char *)0x0 || argc != 1) {
    iVar10 = 0;
    local_1fc = 0;
    do {
      iVar6 = ArgParser::ArgIterator::option((ArgIterator *)local_128);
      if (iVar6 < 0x53) {
        if (iVar6 < 0x31) {
          if (iVar6 == -1) {
            if (local_1e0.pattern._M_string_length == 0) {
              pcVar7 = ArgParser::ArgIterator::getstr((ArgIterator *)local_128);
              __len1 = local_1e0.pattern._M_string_length;
              __len2 = strlen(pcVar7);
              bVar4 = true;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&local_1e0.pattern,0,__len1,pcVar7,__len2);
              goto LAB_001084a7;
            }
            pcVar7 = ArgParser::ArgIterator::getstr((ArgIterator *)local_128);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_248,pcVar7,(allocator<char> *)&local_98);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248);
          }
          else {
            if (iVar6 != 0) {
              if (iVar6 != 0x30) goto switchD_00108042_caseD_73;
              local_1e0.matchstart = true;
              goto LAB_001084a4;
            }
            local_248._0_8_ = &local_238;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"-","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
              != &local_238) {
            operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
          }
        }
        else if (iVar6 < 0x4d) {
          if (iVar6 == 0x31) {
            local_1e0.firstmatch = true;
          }
          else {
            if (iVar6 != 0x49) goto switchD_00108042_caseD_73;
            local_1e0.matchcase = true;
          }
        }
        else if (iVar6 == 0x4d) {
          local_1e0.maxfilesize = ArgParser::ArgIterator::getint((ArgIterator *)local_128);
        }
        else {
          if (iVar6 != 0x51) goto switchD_00108042_caseD_73;
          local_1e0.use_sequential = true;
        }
        goto LAB_001084a4;
      }
      switch(iVar6) {
      case 0x62:
        local_1e0.matchbinary = true;
        break;
      case 99:
        local_1e0.count_only = true;
        break;
      case 100:
      case 0x65:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
switchD_00108042_caseD_73:
        usage();
        iVar10 = 1;
        bVar4 = false;
        goto LAB_001084a7;
      case 0x66:
        local_1e0.readcontinuous = true;
        break;
      case 0x67:
        local_1e0.pattern_is_guid = true;
        break;
      case 0x6c:
        local_1e0.list_only = true;
        break;
      default:
        if (iVar6 - 0x72U < 7) {
          switch(iVar6) {
          case 0x72:
            bVar4 = true;
            local_1fc = (uint)CONCAT71((int7)((ulong)((long)&switchD_00108042::switchdataD_0013405c
                                                     + (long)(int)(&switchD_00108042::
                                                                    switchdataD_0013405c)
                                                                  [iVar6 - 0x72U]) >> 8),1);
            goto LAB_001084a7;
          default:
            goto switchD_00108042_caseD_73;
          case 0x76:
            iVar6 = ArgParser::ArgIterator::count((ArgIterator *)local_128);
            local_1e0.verbose = local_1e0.verbose + iVar6;
            break;
          case 0x77:
            local_1e0.matchword = true;
            break;
          case 0x78:
            local_1e0.pattern_is_hex = true;
          }
          break;
        }
        if (iVar6 != 0x53) goto switchD_00108042_caseD_73;
        pcVar7 = ArgParser::ArgIterator::getstr((ArgIterator *)local_128);
        local_248._8_8_ = (pointer)0x5;
        local_238._M_dataplus._M_p._0_6_ = 0x7865676572;
        local_248._0_8_ = &local_238;
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248,pcVar7);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_ !=
            &local_238) {
          operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
        }
        if (iVar6 == 0) {
          local_1e0._28_8_ = local_1e0._28_8_ & 0xffffffff;
        }
        else {
          local_248._8_8_ = (pointer)0x3;
          local_238._M_dataplus._M_p._0_4_ = 0x647473;
          local_248._0_8_ = &local_238;
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_248,pcVar7);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
              != &local_238) {
            operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
          }
          if (iVar6 == 0) {
            local_1e0.searchtype = 1;
          }
          else {
            local_248._8_8_ = (pointer)0x5;
            local_238._M_dataplus._M_p._0_6_ = 0x6d62647473;
            local_248._0_8_ = &local_238;
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_248,pcVar7);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248._0_8_
                != &local_238) {
              operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
            }
            if (iVar6 == 0) {
              local_1e0.searchtype = 2;
            }
            else {
              local_248._8_8_ = (pointer)0x6;
              local_238._M_dataplus._M_p._0_7_ = 0x686d62647473;
              local_248._0_8_ = &local_238;
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_248,pcVar7);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_248._0_8_ != &local_238) {
                operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
              }
              if (iVar6 == 0) {
                local_1e0.searchtype = 3;
              }
              else {
                local_238._M_dataplus._M_p = (pointer)0x6d6274736f6f62;
                local_248._8_8_ = (pointer)0x7;
                local_248._0_8_ = &local_238;
                iVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248,pcVar7);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_248._0_8_ != &local_238) {
                  operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
                }
                if (iVar6 == 0) {
                  local_1e0.searchtype = 4;
                }
                else {
                  local_238._M_dataplus._M_p = (pointer)0x686d6274736f6f62;
                  local_248._8_8_ = (pointer)0x8;
                  local_238._M_string_length._0_1_ = '\0';
                  local_248._0_8_ = &local_238;
                  iVar6 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_248,pcVar7);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_248._0_8_ != &local_238) {
                    operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
                  }
                  if (iVar6 == 0) {
                    local_1e0.searchtype = 5;
                  }
                  else {
                    local_238._M_dataplus._M_p = (pointer)0x706d6b74736f6f62;
                    local_248._8_8_ = (pointer)0x8;
                    local_238._M_string_length._0_1_ = '\0';
                    local_248._0_8_ = &local_238;
                    iVar6 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_248,pcVar7);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248._0_8_ != &local_238) {
                      operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1);
                    }
                    if (iVar6 != 0) {
                      local_248._8_8_ = (pointer)0x4;
                      local_238._M_dataplus._M_p._0_5_ = 0x6b73616d;
                      local_248._0_8_ = &local_238;
                      iVar6 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_248,pcVar7);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_248._0_8_ != &local_238) {
                        operator_delete((void *)local_248._0_8_,(long)local_238._M_dataplus._M_p + 1
                                       );
                      }
                      bVar4 = true;
                      if (iVar6 == 0) {
                        local_1e0.searchtype = 7;
                      }
                      goto LAB_001084a7;
                    }
                    local_1e0.searchtype = 6;
                  }
                }
              }
            }
          }
        }
        bVar4 = true;
        goto LAB_001084a7;
      }
LAB_001084a4:
      bVar4 = true;
LAB_001084a7:
      if (!bVar4) break;
      lVar8 = (long)(int)local_128._12_4_;
      if (local_128._12_4_ != local_128._8_4_) {
        local_128._12_4_ = local_128._12_4_ + 1;
        local_108._0_1_ = false;
        local_108._1_1_ = false;
        if (local_128._12_4_ == local_128._8_4_) {
          local_128._16_8_ = (char *)0x0;
          local_128._24_8_ = (char *)0x0;
        }
        else {
          local_128._16_8_ = *(undefined8 *)(local_128._0_8_ + lVar8 * 8 + 8);
          if (*(char *)local_128._16_8_ == '\0') {
            lVar8 = 0;
          }
          else {
            lVar9 = 0;
            do {
              lVar8 = lVar9 + 1;
              lVar1 = lVar9 + 1;
              lVar9 = lVar8;
            } while (*(char *)(local_128._16_8_ + lVar1) != '\0');
          }
          local_128._24_8_ = local_128._16_8_ + lVar8;
        }
      }
      bVar11 = (char *)local_128._16_8_ != (char *)0x0 || local_128._12_4_ != argc;
    } while (bVar11);
  }
  else {
    local_1fc = 0;
    iVar10 = 0;
  }
  iVar6 = iVar10;
  if (!bVar11) {
    if (local_1e0.pattern._M_string_length == 0) {
      usage();
      iVar6 = 1;
    }
    else {
      if (local_1e0.pattern_is_hex == true) {
        local_1e0.matchbinary = true;
        local_1e0.matchcase = true;
      }
      if (local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_1f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_128._0_8_ = local_128 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"-","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
        if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
          operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
        }
      }
      bVar11 = findstr::compile_pattern(&local_1e0);
      iVar6 = 1;
      if (bVar11) {
        if (1 < local_1e0.verbose) {
          fprint<std::__cxx11::string&>(_stdout,"Compiled regex: %s\n",&local_1e0.pattern);
          ppVar3 = local_1e0.bytemasks.
                   super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (args_00 = local_1e0.bytemasks.
                         super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; args_00 != ppVar3;
              args_00 = args_00 + 1) {
            fprint<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      (_stdout,"Compiled bytes: %-b\n",&args_00->first);
            fprint<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      (_stdout,"Compiled  mask: %-b\n",&args_00->second);
          }
        }
        pbVar2 = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_1f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar6 = 0;
        }
        else {
          local_200 = 0;
          this = local_1f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(this,"-");
            if (iVar6 == 0) {
              findstr::searchstdin(&local_1e0);
LAB_00108987:
              bVar5 = (byte)local_200 & 1;
              if ((local_200 & 1) != 0) {
                iVar10 = 0;
              }
            }
            else {
              iVar6 = stat((this->_M_dataplus)._M_p,(stat *)local_128);
              if (iVar6 == -1) {
                bVar5 = 8;
                bVar11 = false;
              }
              else {
                bVar5 = 0;
                bVar11 = true;
                if ((local_128._24_4_ & 0xf000) == 0x4000) {
                  if ((local_1fc & 1) != 0) {
                    fileenumerator::fileenumerator(&local_50,this,1,SINGLE);
                    fileenumerator::begin((iter *)local_248,&local_50);
                    local_98.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                    local_98._20_8_ = 0;
                    local_98.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_98.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    local_98.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    local_98.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_98.cur.ent = (dirent *)0x0;
                    local_98.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_98.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    while (bVar4 = fileenumerator::iter::operator!=((iter *)local_248,&local_98),
                          bVar4) {
                      fileenumerator::iter::operator*[abi_cxx11_(&local_150,(iter *)local_248);
                      findstr::searchfile(&local_1e0,
                                          &local_150.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                           ._M_head_impl);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_150.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                             ._M_head_impl._M_dataplus._M_p !=
                          &local_150.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           ._M_head_impl.field_2) {
                        operator_delete(local_150.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                        ._M_head_impl._M_dataplus._M_p,
                                        local_150.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                        ._M_head_impl.field_2._M_allocated_capacity + 1);
                      }
                      fileenumerator::iter::nextent((iter *)local_248);
                    }
                    if (local_98.stack.
                        super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_98.stack.
                                      super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_98.stack.
                                            super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_98.stack.
                                            super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_98);
                    if ((void *)local_238.field_2._M_allocated_capacity != (void *)0x0) {
                      operator_delete((void *)local_238.field_2._M_allocated_capacity,
                                      (long)local_218 - local_238.field_2._0_8_);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_248);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_50);
                  }
                }
                else {
                  findstr::searchfile(&local_1e0,this);
                }
              }
              if (bVar11) goto LAB_00108987;
            }
            if ((bVar5 & 7) != 0) goto LAB_00108a5d;
            this = this + 1;
          } while (this != pbVar2);
          bVar5 = 7;
LAB_00108a5d:
          iVar6 = iVar10;
          if (bVar5 == 7) {
            iVar6 = 0;
          }
        }
      }
    }
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  std::
  vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~vector(&local_1e0.bytemasks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.pattern._M_dataplus._M_p != &local_1e0.pattern.field_2) {
    operator_delete(local_1e0.pattern._M_dataplus._M_p,
                    CONCAT71(local_1e0.pattern.field_2._M_allocated_capacity._1_7_,
                             local_1e0.pattern.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    bool recurse_dirs = false;
    std::vector<std::string> args;
    findstr  f;
    std::string excludepaths;

    for (auto& arg : ArgParser(argc, argv))
        switch (arg.option())
        {
            case 'w': f.matchword = true; break;
            case 'b': f.matchbinary = true; break;
            case 'I': f.matchcase = true; break;
            case '0': f.matchstart = true; break;
            case '1': f.firstmatch = true; break;
            case 'x': f.pattern_is_hex = true; break;
            case 'g': f.pattern_is_guid = true; break;
            case 'v': f.verbose += arg.count(); break;
            case 'r': recurse_dirs = true; break;
            case 'l': f.list_only = true; break;
            case 'c': f.count_only = true; break;
            case 'f': f.readcontinuous = true; break;
            case 'M': f.maxfilesize = arg.getint(); break;
            //case 'X': excludepaths = arg.getstr(); break;
#ifdef WITH_MEMSEARCH
            case 'o': f.memoffset = arg.getint(); break;
            case 'L': f.memsize = arg.getint(); break;
            case 'h': f.pid = arg.getint(); break;
#endif
            case 'S': 
                      {
                      auto mode = arg.getstr();
                      if (mode == "regex"s) f.searchtype = REGEX_SEARCH;
                      else if (mode == "std"s) f.searchtype = STD_SEARCH;
                      else if (mode == "stdbm"s) f.searchtype = STD_BOYER_MOORE;
                      else if (mode == "stdbmh"s) f.searchtype = STD_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostbm"s) f.searchtype = BOOST_BOYER_MOORE;
                      else if (mode == "boostbmh"s) f.searchtype = BOOST_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostkmp"s) f.searchtype = BOOST_KNUTH_MORRIS_PRATT;
                      else if (mode == "mask"s) f.searchtype = BYTEMASK_SEARCH;
                      }
                      break;
            case 'Q': f.use_sequential = true; break;
            case 0:
                      args.push_back("-");
                      break;
            case -1:
                if (f.pattern.empty()) 
                    f.pattern = arg.getstr();
                else {
                    args.push_back(arg.getstr());
                }
                break;
            default:
                usage();
                return 1;
        }

    if (f.pattern.empty()) {
        usage();
        return 1;
    }
    if (f.pattern_is_hex) {
        f.matchbinary = true;
        f.matchcase = true;
    }
    //std::set<std::string> exclude;
    //for (auto i : tokenize(excludepaths, ':'))
    //    exclude.insert(i);

#ifdef WITH_MEMSEARCH
    if (!f.memoffset)
#endif
    if (args.empty())
        args.push_back("-");
    if (!f.compile_pattern())
        return 1;
    if (f.verbose > 1) {
        print("Compiled regex: %s\n", f.pattern);
        for (auto & bm : f.bytemasks) {
            print("Compiled bytes: %-b\n", bm.first);
            print("Compiled  mask: %-b\n", bm.second);
        }
    }
    bool stop = false;
#ifdef WITH_MEMSEARCH
    if (f.memoffset)
        catchall(f.searchmemory(), "memory");
#endif
    if (stop)
        return 0;

    for (auto const& arg : args) {
        if (arg == "-")
            f.searchstdin();
        else {
            struct stat st;
            if (-1 == stat(arg.c_str(), &st))
                continue;

            if ((st.st_mode & S_IFMT) == S_IFDIR) {
                if (recurse_dirs)
                    for (auto [fn, ent] : fileenumerator(arg))
                        catchall(f.searchfile(fn), fn);
            }
            //      [recurse_dirs,&exclude](const std::string& fn)->bool { 
            //          return exclude.find(fn)==exclude.end() && recurse_dirs;
            //      }
            else {
                catchall(f.searchfile(arg), arg);
            }
        }

        if (stop)
            return 0;
    }

    return 0;
}